

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits_container_tests.cpp
# Opt level: O0

bool anon_unknown.dwarf_3803e7e::ns::operator==
               (Project<std::set<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>
                *lhs,Project<std::set<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>
                     *rhs)

{
  __type_conflict1 _Var1;
  set<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
  *in_RSI;
  int *in_RDI;
  uint7 in_stack_ffffffffffffffe8;
  bool bVar2;
  
  bVar2 = false;
  if (*in_RDI == *(int *)&(in_RSI->_M_t)._M_impl) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lhs
                            ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             rhs);
    bVar2 = false;
    if (_Var1) {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)rhs);
      bVar2 = false;
      if (_Var1) {
        _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)rhs);
        bVar2 = false;
        if ((_Var1) &&
           (bVar2 = false,
           (*(undefined1 *)(in_RDI + 0x1a) & _S_black) ==
           ((char)in_RSI[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_color & _S_black))) {
          bVar2 = std::operator==(in_RSI,(set<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
                                          *)(ulong)in_stack_ffffffffffffffe8);
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool operator==(const Project& lhs, const Project& rhs)
        {
            return (lhs.version == rhs.version && 
                lhs.name == rhs.name &&
                lhs.author == rhs.author &&
                lhs.notes == rhs.notes &&
                lhs.showNotes == rhs.showNotes &&
                lhs.values == rhs.values);
        }